

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_listen_accept(intptr_t uuid,fio_protocol_s *protocol)

{
  void *obj;
  fio_protocol_s *protocol_00;
  intptr_t client;
  fio_protocol_s *protocol_local;
  intptr_t uuid_local;
  
  while( true ) {
    obj = (void *)fio_accept(uuid);
    if (obj == (void *)0xffffffffffffffff) break;
    protocol_00 = fio_cluster_protocol_alloc
                            ((intptr_t)obj,fio_cluster_server_handler,fio_cluster_server_sender);
    fio_attach((intptr_t)obj,protocol_00);
    fio_lock(&cluster_data.lock);
    fio_ls_push(&cluster_data.clients,obj);
    fio_unlock(&cluster_data.lock);
  }
  return;
}

Assistant:

static void fio_cluster_listen_accept(intptr_t uuid, fio_protocol_s *protocol) {
  (void)protocol;
  /* prevent `accept` backlog in parent */
  intptr_t client;
  while ((client = fio_accept(uuid)) != -1) {
    fio_attach(client,
               fio_cluster_protocol_alloc(client, fio_cluster_server_handler,
                                          fio_cluster_server_sender));
    fio_lock(&cluster_data.lock);
    fio_ls_push(&cluster_data.clients, (void *)client);
    fio_unlock(&cluster_data.lock);
  }
}